

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopUtil.c
# Opt level: O1

void Hop_ManPrintVerbose(Hop_Man_t *p,int fHaig)

{
  Vec_Ptr_t *pVVar1;
  void *pvVar2;
  long lVar3;
  
  pvVar2 = (void *)(ulong)(uint)fHaig;
  printf("PIs: ");
  pVVar1 = p->vPis;
  if (0 < pVVar1->nSize) {
    lVar3 = 0;
    do {
      pvVar2 = pVVar1->pArray[lVar3];
      printf(" %p");
      lVar3 = lVar3 + 1;
      pVVar1 = p->vPis;
    } while (lVar3 < pVVar1->nSize);
  }
  putchar(10);
  pVVar1 = Hop_ManDfs(p);
  if (0 < pVVar1->nSize) {
    lVar3 = 0;
    do {
      Hop_ObjPrintVerbose((Hop_Obj_t *)pVVar1->pArray[lVar3],(int)pvVar2);
      putchar(10);
      lVar3 = lVar3 + 1;
    } while (lVar3 < pVVar1->nSize);
  }
  putchar(10);
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
    return;
  }
  return;
}

Assistant:

void Hop_ManPrintVerbose( Hop_Man_t * p, int fHaig )
{
    Vec_Ptr_t * vNodes;
    Hop_Obj_t * pObj;
    int i;
    printf( "PIs: " );
    Hop_ManForEachPi( p, pObj, i )
        printf( " %p", pObj );
    printf( "\n" );
    vNodes = Hop_ManDfs( p );
    Vec_PtrForEachEntry( Hop_Obj_t *, vNodes, pObj, i )
        Hop_ObjPrintVerbose( pObj, fHaig ), printf( "\n" );
    printf( "\n" );
    Vec_PtrFree( vNodes );
}